

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O2

bool __thiscall booster::aio::basic_io_device::dont_block(basic_io_device *this,io_handler *h)

{
  io_service *this_00;
  bool bVar1;
  error_code e;
  
  bVar1 = true;
  if (this->nonblocking_was_set_ == false) {
    e._M_value = 0;
    e._M_cat = (error_category *)std::_V2::system_category();
    set_non_blocking(this,true,&e);
    bVar1 = e._M_value == 0;
    if (bVar1) {
      this->nonblocking_was_set_ = true;
    }
    else {
      this_00 = get_io_service(this);
      io_service::post(this_00,h,&e,0);
    }
  }
  return bVar1;
}

Assistant:

bool basic_io_device::dont_block(io_handler const &h)
{
	if(nonblocking_was_set_)
		return true;
	system::error_code e;
	set_non_blocking(true,e);
	if(e) {
		get_io_service().post(h,e,0);
		return false;
	}
	nonblocking_was_set_ = true;
	return true;
}